

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings_tests.cpp
# Opt level: O3

void __thiscall
blockencodings_tests::SufficientPreforwardRTTest::test_method(SufficientPreforwardRTTest *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  long lVar1;
  CTxMemPool *this_01;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined8 uVar5;
  ReadStatus RVar6;
  int iVar7;
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *puVar8;
  uint64_t uVar9;
  CTransaction *__tmp;
  long lVar10;
  CheckBlockFn *this_02;
  size_t *psVar11;
  size_t *psVar12;
  char *pcVar13;
  vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *this_03;
  iterator in_R9;
  iterator pvVar14;
  iterator pvVar15;
  CheckBlockFn *__x;
  pointer psVar16;
  pointer psVar17;
  long in_FS_OFFSET;
  bool bVar18;
  readonly_property<bool> rVar19;
  byte bVar20;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  check_type cVar21;
  undefined1 *local_818;
  undefined1 *local_810;
  char *local_808;
  char *local_800;
  undefined1 *local_7f8;
  undefined1 *local_7f0;
  char *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  undefined1 *local_7c8;
  undefined1 *local_7c0;
  char *local_7b8;
  char *local_7b0;
  undefined1 *local_7a8;
  undefined1 *local_7a0;
  char *local_798;
  char *local_790;
  DataStream local_788;
  undefined1 *local_768;
  undefined1 *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  undefined1 *local_738;
  undefined1 *local_730;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  undefined1 *local_6e8;
  undefined1 *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  undefined1 *local_688;
  undefined1 *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  DataStream local_638;
  undefined1 *local_618;
  undefined1 *local_610;
  char *local_608;
  char *local_600;
  TestMemPoolEntryHelper entry;
  bool mutated;
  string *local_5b0;
  char *local_5a8;
  assertion_result local_5a0;
  string *local_588;
  assertion_result local_580;
  string **local_568;
  undefined1 local_560 [32];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  undefined1 local_520 [16];
  shared_count asStack_510 [2];
  undefined1 local_500 [32];
  _Alloc_hider local_4e0;
  header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
  local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  undefined1 local_4c0 [32];
  PartiallyDownloadedBlock partialBlockCopy;
  undefined1 local_3f8 [8];
  element_type *peStack_3f0;
  shared_count sStack_3e8;
  undefined1 *puStack_3e0;
  uint64_t local_3d8;
  _Base_ptr p_Stack_3d0;
  _Base_ptr local_3c8;
  _Base_ptr p_Stack_3c0;
  pointer local_3b8;
  size_type sStack_3b0;
  undefined1 local_3a8 [32];
  CBlockHeaderAndShortTxIDs shortIDs2;
  TestHeaderAndShortIDs shortIDs;
  uint256 txhash;
  PartiallyDownloadedBlock partialBlock;
  CBlock block;
  FastRandomContext rand_ctx;
  
  bVar20 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar13 = "m_node.mempool";
  puVar8 = inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
                     (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                       super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
                      ,0xdb,"test_method","m_node.mempool");
  this_01 = (puVar8->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  entry.nFee = 0;
  entry.time.__d.__r = (duration)0;
  entry.nHeight = 1;
  entry.m_sequence = 0;
  entry.spendsCoinbase = false;
  entry.sigOpCost = 4;
  entry.lp.height = 0;
  entry.lp.time = 0;
  entry.lp.maxInputBlock = (CBlockIndex *)0x0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  partialBlock.prefilled_count = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x2a;
  FastRandomContext::FastRandomContext(&rand_ctx,(uint256 *)&partialBlock);
  BuildBlockTestCase(&block,&rand_ctx);
  criticalblock1.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock1.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock1.super_unique_lock);
  criticalblock2.super_unique_lock._M_device = &(this_01->cs).super_recursive_mutex;
  criticalblock2.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock2.super_unique_lock);
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)&partialBlock,&entry,
             block.vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1);
  CTxMemPool::addUnchecked(this_01,(CTxMemPoolEntry *)&partialBlock);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)(partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 4));
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&partialBlock.txn_available.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(partialBlock.txn_available.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish._1_7_,
               partialBlock.txn_available.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish._0_1_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(partialBlock.txn_available.
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                        partialBlock.txn_available.
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish._0_1_));
  }
  local_608 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_600 = "";
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xe2;
  file.m_begin = (iterator)&local_608;
  msg.m_end = in_R9;
  msg.m_begin = pcVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_618,msg);
  shortIDs2.shorttxidk1._0_1_ = 0;
  shortIDs2.shorttxidk0 = (uint64_t)&PTR__lazy_ostream_01388f08;
  shortIDs2.nonce = (uint64_t)boost::unit_test::lazy_ostream::inst;
  shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xf4aea1;
  CTxMemPool::get((CTxMemPool *)local_560,(uint256 *)this_01);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_638.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
  }
  else {
    local_638.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(long)*(_Atomic_word *)(local_560._8_8_ + 8);
  }
  local_580._0_8_ = &local_638;
  txhash.super_base_blob<256U>.m_data._M_elems._0_8_ = &local_788;
  local_788.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4;
  shortIDs.header.nVersion._0_1_ =
       local_638.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start == (pointer)0x4;
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_3f8 = (undefined1  [8])0xe406e3;
  peStack_3f0 = (element_type *)0xe40750;
  partialBlock.prefilled_count = (size_t)&local_580;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0xa8;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ = 0x13892;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0x139d1;
  partialBlockCopy.prefilled_count = (size_t)&txhash;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013892a8;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  pvVar14 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&shortIDs,(lazy_ostream *)&shortIDs2,1,2,REQUIRE,0xe40ac0,
             (size_t)local_3f8,0xe2,(CTxMemPoolEntry *)&partialBlock,"SHARED_TX_OFFSET + 0",
             &partialBlockCopy);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560._8_8_);
  }
  txhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  TestHeaderAndShortIDs::TestHeaderAndShortIDs(&shortIDs,&block,&rand_ctx);
  this_03 = &shortIDs.prefilledtxn;
  std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::resize(this_03,2);
  peVar2 = ((block.vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = ((block.vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (shortIDs.prefilledtxn.
   super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
   super__Vector_impl_data._M_start)->index = 0;
  ((shortIDs.prefilledtxn.
    super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
    super__Vector_impl_data._M_start)->tx).
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  p_Var4 = ((shortIDs.prefilledtxn.
             super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl
             .super__Vector_impl_data._M_start)->tx).
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  ((shortIDs.prefilledtxn.
    super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
    super__Vector_impl_data._M_start)->tx).
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  peVar2 = block.vtx.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = block.vtx.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  shortIDs.prefilledtxn.
  super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
  super__Vector_impl_data._M_start[1].index = 1;
  shortIDs.prefilledtxn.
  super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
  super__Vector_impl_data._M_start[1].tx.
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  p_Var4 = shortIDs.prefilledtxn.
           super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
           super__Vector_impl_data._M_start[1].tx.
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  shortIDs.prefilledtxn.
  super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
  super__Vector_impl_data._M_start[1].tx.
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  this_00 = &shortIDs.shorttxids;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_00,1);
  uVar9 = TestHeaderAndShortIDs::GetShortID
                    (&shortIDs,
                     &(block.vtx.
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      m_witness_hash);
  *shortIDs.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = uVar9;
  local_638.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_638.m_read_pos = 0;
  local_638.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_638.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = SUB81(this_00,0);
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ = (undefined7)((ulong)this_00 >> 8);
  SerializeMany<DataStream,CBlockHeader,unsigned_long,Wrapper<VectorFormatter<CustomUintFormatter<6,false>>,std::vector<unsigned_long,std::allocator<unsigned_long>>const&>,std::vector<PrefilledTransaction,std::allocator<PrefilledTransaction>>>
            (&local_638,&shortIDs.header,&shortIDs.nonce,
             (Wrapper<VectorFormatter<CustomUintFormatter<6,_false>_>,_const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&>
              *)&partialBlock,this_03);
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  shortIDs2.header.nTime = 0;
  shortIDs2.header.nBits = 0;
  shortIDs2.header.nNonce = 0;
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  shortIDs2.header.nVersion = 0;
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  shortIDs2.prefilledtxn.
  super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  shortIDs2.prefilledtxn.
  super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shortIDs2.prefilledtxn.
  super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  CBlockHeaderAndShortTxIDs::
  SerializationOps<DataStream,CBlockHeaderAndShortTxIDs,ActionUnserialize>(&shortIDs2,&local_638);
  partialBlock.mempool_count = 0;
  partialBlock.extra_count = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  partialBlock.prefilled_count = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  partialBlock.header.nVersion = 0;
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  partialBlock.header.nTime = 0;
  partialBlock.header.nBits = 0;
  partialBlock.header.nNonce = 0;
  partialBlock.m_check_block_mock.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  partialBlock.m_check_block_mock.super__Function_base._M_functor._8_8_ = 0;
  partialBlock.m_check_block_mock.super__Function_base._M_manager = (_Manager_type)0x0;
  partialBlock.m_check_block_mock._M_invoker = (_Invoker_type)0x0;
  local_648 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_640 = "";
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xf6;
  file_00.m_begin = (iterator)&local_648;
  msg_00.m_end = pvVar14;
  msg_00.m_begin = (iterator)this_03;
  partialBlock.pool = this_01;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_658,
             msg_00);
  _cVar21 = 0x2d910f;
  RVar6 = PartiallyDownloadedBlock::InitData(&partialBlock,&shortIDs2,&empty_extra_txn);
  peStack_3f0 = (element_type *)0x0;
  sStack_3e8.pi_ = (sp_counted_base *)0x0;
  local_560._0_8_ = "partialBlock.InitData(shortIDs2, empty_extra_txn) == READ_STATUS_OK";
  local_560._8_8_ = "";
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389048;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_668 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_660 = "";
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  partialBlockCopy.prefilled_count = (size_t)local_560;
  local_3f8[0] = (class_property<bool>)(class_property<bool>)(RVar6 == READ_STATUS_OK);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3f8,(lazy_ostream *)&partialBlockCopy,1,0,WARN,_cVar21,
             (size_t)&local_668,0xf6);
  boost::detail::shared_count::~shared_count(&sStack_3e8);
  local_678 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_670 = "";
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xf7;
  file_01.m_begin = (iterator)&local_678;
  msg_01.m_end = pvVar15;
  msg_01.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_688,
             msg_01);
  _cVar21 = 0x2d91ed;
  local_3f8[0] = (class_property<bool>)PartiallyDownloadedBlock::IsTxAvailable(&partialBlock,0);
  peStack_3f0 = (element_type *)0x0;
  sStack_3e8.pi_ = (sp_counted_base *)0x0;
  local_560._0_8_ = "partialBlock.IsTxAvailable(0)";
  local_560._8_8_ = "";
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389048;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_698 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_690 = "";
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  partialBlockCopy.prefilled_count = (size_t)local_560;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3f8,(lazy_ostream *)&partialBlockCopy,1,0,WARN,_cVar21,
             (size_t)&local_698,0xf7);
  boost::detail::shared_count::~shared_count(&sStack_3e8);
  local_6a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_6a0 = "";
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xf8;
  file_02.m_begin = (iterator)&local_6a8;
  msg_02.m_end = pvVar15;
  msg_02.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_6b8,
             msg_02);
  _cVar21 = 0x2d92c4;
  local_3f8[0] = (class_property<bool>)PartiallyDownloadedBlock::IsTxAvailable(&partialBlock,1);
  peStack_3f0 = (element_type *)0x0;
  sStack_3e8.pi_ = (sp_counted_base *)0x0;
  local_560._0_8_ = "partialBlock.IsTxAvailable(1)";
  local_560._8_8_ = "";
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389048;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_6c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_6c0 = "";
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  partialBlockCopy.prefilled_count = (size_t)local_560;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3f8,(lazy_ostream *)&partialBlockCopy,1,0,WARN,_cVar21,
             (size_t)&local_6c8,0xf8);
  boost::detail::shared_count::~shared_count(&sStack_3e8);
  local_6d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_6d0 = "";
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xf9;
  file_03.m_begin = (iterator)&local_6d8;
  msg_03.m_end = pvVar15;
  msg_03.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_6e8,
             msg_03);
  _cVar21 = 0x2d939b;
  local_3f8[0] = (class_property<bool>)PartiallyDownloadedBlock::IsTxAvailable(&partialBlock,2);
  peStack_3f0 = (element_type *)0x0;
  sStack_3e8.pi_ = (sp_counted_base *)0x0;
  local_560._0_8_ = "partialBlock.IsTxAvailable(2)";
  local_560._8_8_ = "";
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389048;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_6f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_6f0 = "";
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  partialBlockCopy.prefilled_count = (size_t)local_560;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3f8,(lazy_ostream *)&partialBlockCopy,1,0,WARN,_cVar21,
             (size_t)&local_6f8,0xf9);
  boost::detail::shared_count::~shared_count(&sStack_3e8);
  local_708 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_700 = "";
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xfb;
  file_04.m_begin = (iterator)&local_708;
  msg_04.m_end = pvVar15;
  msg_04.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_718,
             msg_04);
  local_560._8_8_ = local_560._8_8_ & 0xffffffffffffff00;
  local_560._0_8_ = &PTR__lazy_ostream_01388f08;
  local_560._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_560._24_8_ = "";
  CTxMemPool::get((CTxMemPool *)local_4c0,(uint256 *)this_01);
  if ((element_type *)local_4c0._8_8_ == (element_type *)0x0) {
    local_520._0_8_ = 0;
  }
  else {
    local_520._0_8_ =
         SEXT48(*(int *)&(((wrapped_stream *)local_4c0._8_8_)->
                         super_basic_ostream<char,_std::char_traits<char>_>).field_0x8);
  }
  local_4e0._M_p = local_520;
  local_580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_520._0_8_ == 5);
  local_500._0_8_ = &local_5a0;
  local_5a0._0_8_ = (string **)0x5;
  local_580.m_message.px = (element_type *)0x0;
  local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_788.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xe406e3;
  local_788.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xe40750;
  partialBlockCopy.prefilled_count = (size_t)&local_4e0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013892a8;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  puStack_3e0 = local_500;
  peStack_3f0 = (element_type *)((ulong)peStack_3f0 & 0xffffffffffffff00);
  local_3f8 = (undefined1  [8])&PTR__lazy_ostream_013892a8;
  sStack_3e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_580,(lazy_ostream *)local_560,1,2,REQUIRE,0xe40ac0,(size_t)&local_788,0xfb,
             &partialBlockCopy,"SHARED_TX_OFFSET + 1",(assertion_result *)local_3f8);
  boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
  if ((element_type *)local_4c0._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4c0._8_8_);
  }
  local_3a8._16_3_ = 0;
  local_3a8._19_8_ = 0;
  local_3a8._0_8_ = (pointer)0x0;
  local_3a8._8_3_ = 0;
  local_3a8._11_5_ = 0;
  local_3b8 = (pointer)0x0;
  sStack_3b0 = 0;
  local_3c8 = (_Base_ptr)0x0;
  p_Stack_3c0 = (_Base_ptr)0x0;
  local_3d8 = 0;
  p_Stack_3d0 = (_Base_ptr)0x0;
  sStack_3e8.pi_ = (sp_counted_base *)0x0;
  puStack_3e0 = (undefined1 *)0x0;
  local_3f8 = (undefined1  [8])0x0;
  peStack_3f0 = (element_type *)0x0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&partialBlockCopy.txn_available,&partialBlock.txn_available);
  psVar11 = &partialBlock.prefilled_count;
  psVar12 = &partialBlockCopy.prefilled_count;
  for (lVar10 = 0xe; lVar10 != 0; lVar10 = lVar10 + -1) {
    *psVar12 = *psVar11;
    psVar11 = psVar11 + (ulong)bVar20 * -2 + 1;
    psVar12 = psVar12 + (ulong)bVar20 * -2 + 1;
  }
  this_02 = &partialBlockCopy.m_check_block_mock;
  __x = &partialBlock.m_check_block_mock;
  std::
  function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>::
  function(this_02,__x);
  local_728 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_720 = "";
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xff;
  file_05.m_begin = (iterator)&local_728;
  msg_05.m_end = pvVar15;
  msg_05.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_738,
             msg_05);
  local_788.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_788.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_788.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _cVar21 = 0x2d96c4;
  RVar6 = PartiallyDownloadedBlock::FillBlock
                    (&partialBlock,(CBlock *)local_3f8,
                     (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)&local_788);
  local_580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(RVar6 == READ_STATUS_OK);
  local_580.m_message.px = (element_type *)0x0;
  local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_4c0._0_8_ = "partialBlock.FillBlock(block2, {}) == READ_STATUS_OK";
  local_4c0._8_8_ = "";
  local_560._8_8_ = local_560._8_8_ & 0xffffffffffffff00;
  local_560._0_8_ = &PTR__lazy_ostream_01389048;
  local_560._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_748 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_740 = "";
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  local_560._24_8_ = (CTxMemPool *)local_4c0;
  boost::test_tools::tt_detail::report_assertion
            (&local_580,(lazy_ostream *)local_560,1,0,WARN,_cVar21,(size_t)&local_748,0xff);
  boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_788);
  local_758 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_750 = "";
  local_768 = &boost::unit_test::basic_cstring<char_const>::null;
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x100;
  file_06.m_begin = (iterator)&local_758;
  msg_06.m_end = pvVar15;
  msg_06.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_768,
             msg_06);
  local_788.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_788.vch.
                        super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
                        .super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_788.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f08;
  local_788.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_788.m_read_pos = 0xf4aea1;
  CBlockHeader::GetHash((uint256 *)&local_4e0,&block.super_CBlockHeader);
  base_blob<256u>::ToString_abi_cxx11_((string *)local_4c0,&local_4e0);
  CBlockHeader::GetHash((uint256 *)local_520,(CBlockHeader *)local_3f8);
  base_blob<256u>::ToString_abi_cxx11_((string *)local_500,local_520);
  if (local_4c0._8_8_ == local_500._8_8_) {
    if ((element_type *)local_4c0._8_8_ == (element_type *)0x0) {
      bVar18 = true;
    }
    else {
      iVar7 = bcmp((void *)local_4c0._0_8_,(void *)local_500._0_8_,local_4c0._8_8_);
      bVar18 = iVar7 == 0;
    }
  }
  else {
    bVar18 = false;
  }
  local_5a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar18;
  local_5a0.m_message.px = (element_type *)0x0;
  local_5a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5b0 = (string *)0xe406e3;
  local_5a8 = "";
  local_560._24_8_ = &local_588;
  local_560._8_8_ = local_560._8_8_ & 0xffffffffffffff00;
  local_560._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_560._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_568 = (string **)&mutated;
  local_580.m_message.px = (element_type *)((ulong)local_580.m_message.px & 0xffffffffffffff00);
  local_580._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_580.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x2;
  _mutated = (string *)local_500;
  local_588 = (string *)local_4c0;
  boost::test_tools::tt_detail::report_assertion
            (&local_5a0,(lazy_ostream *)&local_788,1,2,REQUIRE,0xe40927,(size_t)&local_5b0,0x100,
             (lazy_ostream *)local_560,"block2.GetHash().ToString()",&local_580);
  boost::detail::shared_count::~shared_count(&local_5a0.m_message.pn);
  if ((undefined1 *)local_500._0_8_ != local_500 + 0x10) {
    operator_delete((void *)local_500._0_8_,(ulong)(local_500._16_8_ + 1));
  }
  if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
    operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
  }
  local_798 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_790 = "";
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x102;
  file_07.m_begin = (iterator)&local_798;
  msg_07.m_end = pvVar15;
  msg_07.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_7a8,
             msg_07);
  local_788.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_788.vch.
                        super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
                        .super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_788.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f08;
  local_788.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_788.m_read_pos = 0xf4aea1;
  base_blob<256u>::ToString_abi_cxx11_((string *)local_4c0,&block.super_CBlockHeader.hashMerkleRoot)
  ;
  BlockMerkleRoot((uint256 *)local_500,(CBlock *)local_3f8,&mutated);
  base_blob<256u>::ToString_abi_cxx11_((string *)&local_4e0,local_500);
  if ((hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
       *)local_4c0._8_8_ == local_4d8.member) {
    if ((element_type *)local_4c0._8_8_ == (element_type *)0x0) {
      rVar19.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar7 = bcmp((void *)local_4c0._0_8_,local_4e0._M_p,local_4c0._8_8_);
      rVar19.super_class_property<bool>.value = (class_property<bool>)(iVar7 == 0);
    }
  }
  else {
    rVar19.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_520[0] = rVar19.super_class_property<bool>.value;
  local_520._8_8_ = (element_type *)0x0;
  asStack_510[0].pi_ = (sp_counted_base *)0x0;
  local_5a0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_5a0.m_message.px = (element_type *)0xe40750;
  local_560._8_8_ = local_560._8_8_ & 0xffffffffffffff00;
  local_560._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_560._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_560._24_8_ = &local_5b0;
  local_580.m_message.px = (element_type *)((ulong)local_580.m_message.px & 0xffffffffffffff00);
  local_580._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_580.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_568 = &local_588;
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x2;
  local_5b0 = (string *)local_4c0;
  local_588 = (string *)&local_4e0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_520,(lazy_ostream *)&local_788,1,2,REQUIRE,0xe4095e,
             (size_t)&local_5a0,0x102,(lazy_ostream *)local_560,
             "BlockMerkleRoot(block2, &mutated).ToString()",&local_580);
  boost::detail::shared_count::~shared_count(asStack_510);
  if ((string *)local_4e0._M_p != (string *)&local_4d0) {
    operator_delete(local_4e0._M_p,local_4d0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
    operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
  }
  local_7b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_7b0 = "";
  local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar21 = 0x2d9bf5;
  file_08.m_end = (iterator)0x103;
  file_08.m_begin = (iterator)&local_7b8;
  msg_08.m_end = pvVar15;
  msg_08.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_7c8,
             msg_08);
  local_580._0_8_ = CONCAT71(local_580._1_7_,mutated) ^ 1;
  local_580.m_message.px = (element_type *)0x0;
  local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_788.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xe409ab;
  local_788.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xe409b3;
  local_560._8_8_ = local_560._8_8_ & 0xffffffffffffff00;
  local_560._0_8_ = &PTR__lazy_ostream_01389048;
  local_560._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_7d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_7d0 = "";
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  local_560._24_8_ = &local_788;
  boost::test_tools::tt_detail::report_assertion
            (&local_580,(lazy_ostream *)local_560,1,0,WARN,_cVar21,(size_t)&local_7d8,0x103);
  boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
  peVar2 = block.vtx.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  txhash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  txhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  txhash.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  txhash.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  psVar16 = block.vtx.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (block.vtx.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      block.vtx.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      p_Var3 = (psVar16->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      psVar16 = psVar16 + 1;
    } while (psVar16 !=
             block.vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    block.vtx.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         block.vtx.
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  uVar5 = local_3a8._0_8_;
  psVar16 = (pointer)CONCAT53(local_3a8._11_5_,local_3a8._8_3_);
  psVar17 = (pointer)local_3a8._0_8_;
  if (psVar16 != (pointer)local_3a8._0_8_) {
    do {
      p_Var3 = (psVar17->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      psVar17 = psVar17 + 1;
    } while (psVar17 != psVar16);
    local_3a8._8_3_ = (undefined3)uVar5;
    local_3a8._11_5_ = SUB85(uVar5,3);
  }
  local_7e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_7e0 = "";
  local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x108;
  file_09.m_begin = (iterator)&local_7e8;
  msg_09.m_end = pvVar15;
  msg_09.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_7f8,
             msg_09);
  local_788.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_788.vch.
                        super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
                        .super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_788.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f08;
  local_788.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_788.m_read_pos = 0xf4aea1;
  CTxMemPool::get((CTxMemPool *)local_500,(uint256 *)this_01);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_500._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_5b0 = (string *)0x0;
  }
  else {
    local_5b0 = (string *)(long)*(_Atomic_word *)(local_500._8_8_ + 8);
  }
  local_588 = (string *)0x4;
  local_4c0[0] = local_5b0 == (string *)0x4;
  local_4c0._8_8_ = (element_type *)0x0;
  local_4c0._16_8_ = 0;
  local_4e0._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_4d8.member =
       (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
        *)0xe40750;
  local_520._0_8_ = &local_5b0;
  local_560._8_8_ = local_560._8_8_ & 0xffffffffffffff00;
  local_560._0_8_ = &PTR__lazy_ostream_013892a8;
  local_560._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_560._24_8_ = local_520;
  local_5a0._0_8_ = &local_588;
  local_580.m_message.px = (element_type *)((ulong)local_580.m_message.px & 0xffffffffffffff00);
  local_580._0_8_ = &PTR__lazy_ostream_013892a8;
  local_580.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_568 = (string **)&local_5a0;
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_4c0,(lazy_ostream *)&local_788,1,2,REQUIRE,0xe40a5a,
             (size_t)&local_4e0,0x108,(lazy_ostream *)local_560,"SHARED_TX_OFFSET + 1 - 1",
             &local_580);
  boost::detail::shared_count::~shared_count((shared_count *)(local_4c0 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_500._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_500._8_8_);
  }
  if (partialBlockCopy.m_check_block_mock.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*partialBlockCopy.m_check_block_mock.super__Function_base._M_manager)
              ((_Any_data *)this_02,(_Any_data *)this_02,__destroy_functor);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&partialBlockCopy.txn_available);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_3a8);
  if (partialBlock.m_check_block_mock.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*partialBlock.m_check_block_mock.super__Function_base._M_manager)
              ((_Any_data *)__x,(_Any_data *)__x,__destroy_functor);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&partialBlock.txn_available);
  std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::~vector
            (&shortIDs2.prefilledtxn);
  if (shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(shortIDs2.shorttxids.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)shortIDs2.shorttxids.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)shortIDs2.shorttxids.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_638);
  std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::~vector
            (&shortIDs.prefilledtxn);
  if (shortIDs.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(shortIDs.shorttxids.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)shortIDs.shorttxids.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)shortIDs.shorttxids.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_808 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_800 = "";
  local_818 = &boost::unit_test::basic_cstring<char_const>::null;
  local_810 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x10a;
  file_10.m_begin = (iterator)&local_808;
  msg_10.m_end = pvVar15;
  msg_10.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_818,
             msg_10);
  shortIDs2.shorttxidk1._0_1_ = 0;
  shortIDs2.shorttxidk0 = (uint64_t)&PTR__lazy_ostream_01388f08;
  shortIDs2.nonce = (uint64_t)boost::unit_test::lazy_ostream::inst;
  shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xf4aea1;
  CTxMemPool::get((CTxMemPool *)local_560,(uint256 *)this_01);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_788.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
  }
  else {
    local_788.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(long)*(_Atomic_word *)(local_560._8_8_ + 8);
  }
  local_4c0._0_8_ = (pointer)0x3;
  shortIDs.header.nVersion._0_1_ =
       local_788.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start == (pointer)0x3;
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_3f8 = (undefined1  [8])0xe406e3;
  peStack_3f0 = (element_type *)0xe40750;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0xa8;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ = 0x13892;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0x139d1;
  partialBlock.prefilled_count = (size_t)&local_580;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013892a8;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_638.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_4c0;
  local_580._0_8_ = &local_788;
  partialBlockCopy.prefilled_count = (size_t)&local_638;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&shortIDs,(lazy_ostream *)&shortIDs2,1,2,REQUIRE,0xe40a5a,
             (size_t)local_3f8,0x10a,&partialBlock,"SHARED_TX_OFFSET - 1",&partialBlockCopy);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560._8_8_);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&block.vtx);
  ChaCha20::~ChaCha20(&rand_ctx.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SufficientPreforwardRTTest)
{
    CTxMemPool& pool = *Assert(m_node.mempool);
    TestMemPoolEntryHelper entry;
    auto rand_ctx(FastRandomContext(uint256{42}));
    CBlock block(BuildBlockTestCase(rand_ctx));

    LOCK2(cs_main, pool.cs);
    pool.addUnchecked(entry.FromTx(block.vtx[1]));
    BOOST_CHECK_EQUAL(pool.get(block.vtx[1]->GetHash()).use_count(), SHARED_TX_OFFSET + 0);

    uint256 txhash;

    // Test with pre-forwarding coinbase + tx 2 with tx 1 in mempool
    {
        TestHeaderAndShortIDs shortIDs(block, rand_ctx);
        shortIDs.prefilledtxn.resize(2);
        shortIDs.prefilledtxn[0] = {0, block.vtx[0]};
        shortIDs.prefilledtxn[1] = {1, block.vtx[2]}; // id == 1 as it is 1 after index 1
        shortIDs.shorttxids.resize(1);
        shortIDs.shorttxids[0] = shortIDs.GetShortID(block.vtx[1]->GetWitnessHash());

        DataStream stream{};
        stream << shortIDs;

        CBlockHeaderAndShortTxIDs shortIDs2;
        stream >> shortIDs2;

        PartiallyDownloadedBlock partialBlock(&pool);
        BOOST_CHECK(partialBlock.InitData(shortIDs2, empty_extra_txn) == READ_STATUS_OK);
        BOOST_CHECK( partialBlock.IsTxAvailable(0));
        BOOST_CHECK( partialBlock.IsTxAvailable(1));
        BOOST_CHECK( partialBlock.IsTxAvailable(2));

        BOOST_CHECK_EQUAL(pool.get(block.vtx[1]->GetHash()).use_count(), SHARED_TX_OFFSET + 1);

        CBlock block2;
        PartiallyDownloadedBlock partialBlockCopy = partialBlock;
        BOOST_CHECK(partialBlock.FillBlock(block2, {}) == READ_STATUS_OK);
        BOOST_CHECK_EQUAL(block.GetHash().ToString(), block2.GetHash().ToString());
        bool mutated;
        BOOST_CHECK_EQUAL(block.hashMerkleRoot.ToString(), BlockMerkleRoot(block2, &mutated).ToString());
        BOOST_CHECK(!mutated);

        txhash = block.vtx[1]->GetHash();
        block.vtx.clear();
        block2.vtx.clear();
        BOOST_CHECK_EQUAL(pool.get(txhash).use_count(), SHARED_TX_OFFSET + 1 - 1); // + 1 because of partialBlock; -1 because of block.
    }
    BOOST_CHECK_EQUAL(pool.get(txhash).use_count(), SHARED_TX_OFFSET - 1); // -1 because of block
}